

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O3

Map_HashTable_t * Map_SuperTableCreate(Map_SuperLib_t *pLib)

{
  uint uVar1;
  uint uVar2;
  Map_HashTable_t *pMVar3;
  Map_HashEntry_t **ppMVar4;
  uint uVar5;
  int iVar6;
  
  pMVar3 = (Map_HashTable_t *)calloc(1,0x18);
  pMVar3->mmMan = pLib->mmEntries;
  uVar5 = 19999;
  while( true ) {
    do {
      uVar1 = uVar5 + 1;
      uVar2 = uVar5 & 1;
      uVar5 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar6 = 5;
    while (uVar1 % (iVar6 - 2U) != 0) {
      uVar2 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar1 < uVar2) goto LAB_00379369;
    }
  }
LAB_00379369:
  pMVar3->nBins = uVar1;
  ppMVar4 = (Map_HashEntry_t **)calloc(1,(long)(int)uVar1 << 3);
  pMVar3->pBins = ppMVar4;
  return pMVar3;
}

Assistant:

Map_HashTable_t * Map_SuperTableCreate( Map_SuperLib_t * pLib )
{
    Map_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Map_HashTable_t, 1 );
    memset( p, 0, sizeof(Map_HashTable_t) );
    p->mmMan = pLib->mmEntries;
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(20000);
    p->pBins = ABC_ALLOC( Map_HashEntry_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Map_HashEntry_t *) * p->nBins );
    return p;
}